

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O2

u64 u64Bitrev(u64 w)

{
  ulong uVar1;
  
  uVar1 = w >> 0x38 | (w & 0xff000000000000) >> 0x28 | (w & 0xff0000000000) >> 0x18 |
          (w & 0xff00000000) >> 8 | (w & 0xff000000) << 8 | (w & 0xff0000) << 0x18 |
          (w & 0xff00) << 0x28 | w << 0x38;
  uVar1 = (uVar1 & 0xf0f0f0f0f0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f0f0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333) * 4;
  return (uVar1 >> 1 & 0x5555555555555555) + (uVar1 & 0x5555555555555555) * 2;
}

Assistant:

u64 u64Bitrev(register u64 w)
{
	w = ((w >> 1 ) & 0x5555555555555555) | ((w & 0x5555555555555555) << 1);
	w = ((w >> 2 ) & 0x3333333333333333) | ((w & 0x3333333333333333) << 2);
	w = ((w >> 4 ) & 0x0F0F0F0F0F0F0F0F) | ((w & 0x0F0F0F0F0F0F0F0F) << 4);
	w = ((w >> 8 ) & 0x00FF00FF00FF00FF) | ((w & 0x00FF00FF00FF00FF) << 8);
	w = ((w >> 16) & 0x0000FFFF0000FFFF) | ((w & 0x0000FFFF0000FFFF) << 16);
	w = (w >> 32) | (w << 32);
	return w;
}